

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

int Curl_ssl_init(void)

{
  int iVar1;
  
  if (init_ssl == '\0') {
    init_ssl = '\x01';
    if (Curl_ssl->init != (_func_int *)0x0) {
      iVar1 = (*Curl_ssl->init)();
      return iVar1;
    }
  }
  return 1;
}

Assistant:

int Curl_ssl_init(void)
{
  /* make sure this is only done once */
  if(init_ssl)
    return 1;
  init_ssl = TRUE; /* never again */

  if(Curl_ssl->init)
    return Curl_ssl->init();
  return 1;
}